

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_DisallowEnumAlias_Test::TestBody
          (ValidationErrorTest_DisallowEnumAlias_Test *this)

{
  Arg *in_R8;
  string_view format;
  Arg AStack_a8;
  string local_78;
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&AStack_a8,
             "name: \"foo.proto\" enum_type {  name: \"Bar\"  value { name:\"ENUM_A\" number:0 }  value { name:\"ENUM_B\" number:0 }}"
             ,(allocator<char> *)&local_78);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Matcher((Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_28,
            "foo.proto: Bar: NUMBER: \"ENUM_B\" uses the same enum value as \"ENUM_A\". If this is intended, set \'option allow_alias = true;\' to the enum definition. The next available enum value is 1.\n"
           );
  ValidationErrorTest::BuildFileWithErrors
            (&this->super_ValidationErrorTest,(string *)&AStack_a8,
             (Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_28);
  testing::internal::
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~MatcherBase(&local_28);
  std::__cxx11::string::~string((string *)&AStack_a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&AStack_a8,
             "\n        name: \"foo.proto\"\n        enum_type {\n          name: \"Bar\"\n          value { name: \"ENUM_A\" number: 10 }\n          value { name: \"ENUM_B\" number: 10 }\n          value { name: \"ENUM_C\" number: 11 }\n          value { name: \"ENUM_D\" number: 20 }\n        }"
             ,(allocator<char> *)&local_78);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Matcher((Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_40,
            "foo.proto: Bar: NUMBER: \"ENUM_B\" uses the same enum value as \"ENUM_A\". If this is intended, set \'option allow_alias = true;\' to the enum definition. The next available enum value is 12.\n"
           );
  ValidationErrorTest::BuildFileWithErrors
            (&this->super_ValidationErrorTest,(string *)&AStack_a8,
             (Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_40);
  testing::internal::
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~MatcherBase(&local_40);
  std::__cxx11::string::~string((string *)&AStack_a8);
  absl::lts_20250127::substitute_internal::Arg::Arg(&AStack_a8,0x7fffffff);
  format._M_str = (char *)&AStack_a8;
  format._M_len =
       (size_t)
       "\n                         name: \"foo.proto\"\n                         enum_type {\n                           name: \"Bar\"\n                           value { name: \"ENUM_A\" number: $0 }\n                           value { name: \"ENUM_B\" number: $0 }\n                         }"
  ;
  absl::lts_20250127::Substitute_abi_cxx11_(&local_78,(lts_20250127 *)0x110,format,in_R8);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Matcher((Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_58,
            "foo.proto: Bar: NUMBER: \"ENUM_B\" uses the same enum value as \"ENUM_A\". If this is intended, set \'option allow_alias = true;\' to the enum definition.\n"
           );
  ValidationErrorTest::BuildFileWithErrors
            (&this->super_ValidationErrorTest,&local_78,
             (Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_58);
  testing::internal::
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~MatcherBase(&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, DisallowEnumAlias) {
  BuildFileWithErrors(
      "name: \"foo.proto\" "
      "enum_type {"
      "  name: \"Bar\""
      "  value { name:\"ENUM_A\" number:0 }"
      "  value { name:\"ENUM_B\" number:0 }"
      "}",
      "foo.proto: Bar: NUMBER: "
      "\"ENUM_B\" uses the same enum value as \"ENUM_A\". "
      "If this is intended, set 'option allow_alias = true;' to the enum "
      "definition. The next available enum value is 1.\n");

  BuildFileWithErrors(
      R"pb(
        name: "foo.proto"
        enum_type {
          name: "Bar"
          value { name: "ENUM_A" number: 10 }
          value { name: "ENUM_B" number: 10 }
          value { name: "ENUM_C" number: 11 }
          value { name: "ENUM_D" number: 20 }
        })pb",
      "foo.proto: Bar: NUMBER: "
      "\"ENUM_B\" uses the same enum value as \"ENUM_A\". "
      "If this is intended, set 'option allow_alias = true;' to the enum "
      "definition. The next available enum value is 12.\n");

  BuildFileWithErrors(
      absl::Substitute(R"pb(
                         name: "foo.proto"
                         enum_type {
                           name: "Bar"
                           value { name: "ENUM_A" number: $0 }
                           value { name: "ENUM_B" number: $0 }
                         })pb",
                       std::numeric_limits<int32_t>::max()),
      "foo.proto: Bar: NUMBER: "
      "\"ENUM_B\" uses the same enum value as \"ENUM_A\". "
      "If this is intended, set 'option allow_alias = true;' to the enum "
      "definition.\n");
}